

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O2

string * __thiscall
flowtest::join_abi_cxx11_
          (string *__return_storage_ptr__,flowtest *this,initializer_list<flowtest::Token> *tokens)

{
  long lVar1;
  long lVar2;
  Token *in_R8;
  long lVar3;
  string_view format_str;
  Token t;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  for (lVar3 = 0; lVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    t = *(Token *)(lVar1 + lVar3);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    format_str.size_ = (size_t)&t;
    format_str.data_ = (char *)0x2;
    fmt::v5::format<flowtest::Token>(&local_50,(v5 *)0x1767cf,format_str,in_R8);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const std::initializer_list<Token>& tokens) {
  std::string s;
  for (Token t: tokens) {
    if (!s.empty())
      s += ", ";
    s += fmt::format("{}", t);
  }
  return s;
}